

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O1

void uv__write_callbacks(uv_stream_t *stream)

{
  long *plVar1;
  size_t sVar2;
  
  plVar1 = (long *)stream->write_completed_queue[0];
  while( true ) {
    if (stream->write_completed_queue == (void **)plVar1) {
      return;
    }
    *(long *)plVar1[1] = *plVar1;
    *(long *)(*plVar1 + 8) = plVar1[1];
    if (stream->loop->active_reqs == (void **)stream->loop->active_reqs[0]) break;
    *(long *)plVar1[-8] = plVar1[-9];
    *(long *)(plVar1[-9] + 8) = plVar1[-8];
    if (plVar1[3] != 0) {
      sVar2 = uv__write_req_size((uv_write_t *)(plVar1 + -0xb));
      stream->write_queue_size = stream->write_queue_size - sVar2;
      if ((long *)plVar1[3] != plVar1 + 5) {
        uv__free((long *)plVar1[3]);
      }
      plVar1[3] = 0;
    }
    if ((code *)plVar1[-3] != (code *)0x0) {
      (*(code *)plVar1[-3])((uv_write_t *)(plVar1 + -0xb),*(undefined4 *)((long)plVar1 + 0x24));
    }
    plVar1 = (long *)stream->write_completed_queue[0];
  }
  __assert_fail("uv__has_active_reqs(stream->loop)",
                "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/3rdparty/libuv/src/unix/stream.c"
                ,0x3a1,"void uv__write_callbacks(uv_stream_t *)");
}

Assistant:

static void uv__write_callbacks(uv_stream_t* stream) {
  uv_write_t* req;
  QUEUE* q;

  while (!QUEUE_EMPTY(&stream->write_completed_queue)) {
    /* Pop a req off write_completed_queue. */
    q = QUEUE_HEAD(&stream->write_completed_queue);
    req = QUEUE_DATA(q, uv_write_t, queue);
    QUEUE_REMOVE(q);
    uv__req_unregister(stream->loop, req);

    if (req->bufs != NULL) {
      stream->write_queue_size -= uv__write_req_size(req);
      if (req->bufs != req->bufsml)
        uv__free(req->bufs);
      req->bufs = NULL;
    }

    /* NOTE: call callback AFTER freeing the request data. */
    if (req->cb)
      req->cb(req, req->error);
  }

  assert(QUEUE_EMPTY(&stream->write_completed_queue));
}